

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O0

Literal * __thiscall wasm::Literal::demote(Literal *__return_storage_ptr__,Literal *this)

{
  uint uVar1;
  ulong uVar2;
  float fVar3;
  double dVar4;
  uint64_t bits;
  double f64;
  Literal *this_local;
  
  dVar4 = getf64(this);
  uVar1 = std::isnan(dVar4);
  if ((uVar1 & 1) == 0) {
    uVar1 = std::isinf(dVar4);
    if ((uVar1 & 1) == 0) {
      uVar2 = reinterpreti64(this);
      if ((uVar2 < 0x47efffffe0000001) || (0x47efffffefffffff < uVar2)) {
        if ((uVar2 < 0xc7efffffe0000001) || (0xc7efffffefffffff < uVar2)) {
          fVar3 = std::numeric_limits<float>::max();
          if ((double)-fVar3 <= dVar4) {
            fVar3 = std::numeric_limits<float>::max();
            if (dVar4 <= (double)fVar3) {
              dVar4 = getf64(this);
              Literal(__return_storage_ptr__,(float)dVar4);
            }
            else {
              fVar3 = std::numeric_limits<float>::infinity();
              Literal(__return_storage_ptr__,fVar3);
            }
          }
          else {
            fVar3 = std::numeric_limits<float>::infinity();
            Literal(__return_storage_ptr__,-fVar3);
          }
        }
        else {
          fVar3 = std::numeric_limits<float>::max();
          Literal(__return_storage_ptr__,-fVar3);
        }
      }
      else {
        fVar3 = std::numeric_limits<float>::max();
        Literal(__return_storage_ptr__,fVar3);
      }
    }
    else {
      Literal(__return_storage_ptr__,(float)dVar4);
    }
  }
  else {
    Literal(__return_storage_ptr__,(float)dVar4);
  }
  return __return_storage_ptr__;
}

Assistant:

Literal Literal::demote() const {
  auto f64 = getf64();
  if (std::isnan(f64)) {
    return Literal(float(f64));
  }
  if (std::isinf(f64)) {
    return Literal(float(f64));
  }
  // when close to the limit, but still truncatable to a valid value, do that
  // see
  // https://github.com/WebAssembly/sexpr-wasm-prototype/blob/2d375e8d502327e814d62a08f22da9d9b6b675dc/src/wasm-interpreter.c#L247
  uint64_t bits = reinterpreti64();
  if (bits > 0x47efffffe0000000ULL && bits < 0x47effffff0000000ULL) {
    return Literal(std::numeric_limits<float>::max());
  }
  if (bits > 0xc7efffffe0000000ULL && bits < 0xc7effffff0000000ULL) {
    return Literal(-std::numeric_limits<float>::max());
  }
  // when we must convert to infinity, do that
  if (f64 < -std::numeric_limits<float>::max()) {
    return Literal(-std::numeric_limits<float>::infinity());
  }
  if (f64 > std::numeric_limits<float>::max()) {
    return Literal(std::numeric_limits<float>::infinity());
  }
  return Literal(float(getf64()));
}